

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_doc_create(fdb_doc **doc,void *key,size_t keylen,void *meta,size_t metalen,void *body,
              size_t bodylen)

{
  void *pvVar1;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  ulong in_R8;
  void *in_R9;
  fdb_status local_4;
  
  if ((((in_RDI == (long *)0x0) || (0xff80 < in_RDX)) || (0xffff < in_R8)) || (0xffffffff < metalen)
     ) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    pvVar1 = calloc(1,0x50);
    *in_RDI = (long)pvVar1;
    if (*in_RDI == 0) {
      local_4 = FDB_RESULT_ALLOC_FAIL;
    }
    else {
      *(undefined8 *)(*in_RDI + 0x28) = 0xffffffffffffffff;
      if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
        *(undefined8 *)(*in_RDI + 0x20) = 0;
        *(undefined8 *)*in_RDI = 0;
      }
      else {
        pvVar1 = malloc(in_RDX);
        *(void **)(*in_RDI + 0x20) = pvVar1;
        if (*(long *)(*in_RDI + 0x20) == 0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        memcpy(*(void **)(*in_RDI + 0x20),in_RSI,in_RDX);
        *(ulong *)*in_RDI = in_RDX;
      }
      if ((in_RCX == (void *)0x0) || (in_R8 == 0)) {
        *(undefined8 *)(*in_RDI + 0x38) = 0;
        *(undefined8 *)(*in_RDI + 8) = 0;
      }
      else {
        pvVar1 = malloc(in_R8);
        *(void **)(*in_RDI + 0x38) = pvVar1;
        if (*(long *)(*in_RDI + 0x38) == 0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        memcpy(*(void **)(*in_RDI + 0x38),in_RCX,in_R8);
        *(ulong *)(*in_RDI + 8) = in_R8;
      }
      if ((in_R9 == (void *)0x0) || (metalen == 0)) {
        *(undefined8 *)(*in_RDI + 0x40) = 0;
        *(undefined8 *)(*in_RDI + 0x10) = 0;
      }
      else {
        pvVar1 = malloc(metalen);
        *(void **)(*in_RDI + 0x40) = pvVar1;
        if (*(long *)(*in_RDI + 0x40) == 0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        memcpy(*(void **)(*in_RDI + 0x40),in_R9,metalen);
        *(size_t *)(*in_RDI + 0x10) = metalen;
      }
      local_4 = FDB_RESULT_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_create(fdb_doc **doc, const void *key, size_t keylen,
                          const void *meta, size_t metalen,
                          const void *body, size_t bodylen)
{
    if (doc == NULL || keylen > FDB_MAX_KEYLEN ||
        metalen > FDB_MAX_METALEN || bodylen > FDB_MAX_BODYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }

    *doc = (fdb_doc*)calloc(1, sizeof(fdb_doc));
    if (*doc == NULL) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    (*doc)->seqnum = SEQNUM_NOT_USED;

    if (key && keylen > 0) {
        (*doc)->key = (void *)malloc(keylen);
        if ((*doc)->key == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->key, key, keylen);
        (*doc)->keylen = keylen;
    } else {
        (*doc)->key = NULL;
        (*doc)->keylen = 0;
    }

    if (meta && metalen > 0) {
        (*doc)->meta = (void *)malloc(metalen);
        if ((*doc)->meta == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->meta, meta, metalen);
        (*doc)->metalen = metalen;
    } else {
        (*doc)->meta = NULL;
        (*doc)->metalen = 0;
    }

    if (body && bodylen > 0) {
        (*doc)->body = (void *)malloc(bodylen);
        if ((*doc)->body == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->body, body, bodylen);
        (*doc)->bodylen = bodylen;
    } else {
        (*doc)->body = NULL;
        (*doc)->bodylen = 0;
    }

    return FDB_RESULT_SUCCESS;
}